

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::generate_verilog_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top,SystemVerilogCodeGenOptions *options)

{
  SystemVerilogCodeGenOptions *top_00;
  ulong uVar1;
  SystemVerilogCodeGenOptions *options_00;
  SystemVerilogCodeGenOptions local_e0;
  Generator *local_20;
  SystemVerilogCodeGenOptions *options_local;
  Generator *top_local;
  
  options_00 = (SystemVerilogCodeGenOptions *)__return_storage_ptr__;
  local_20 = top;
  options_local = (SystemVerilogCodeGenOptions *)this;
  top_local = (Generator *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  top_00 = options_local;
  if ((uVar1 & 1) == 0) {
    SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions
              (&local_e0,(SystemVerilogCodeGenOptions *)top);
    generate_verilog_pkg((Generator *)top_00,&local_e0);
    SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions(&local_e0);
    memset(__return_storage_ptr__,0,0x30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(__return_storage_ptr__);
  }
  else {
    SystemVerilogCodeGenOptions::SystemVerilogCodeGenOptions
              ((SystemVerilogCodeGenOptions *)&stack0xffffffffffffff88,
               (SystemVerilogCodeGenOptions *)top);
    generate_verilog_no_pkg_abi_cxx11_
              (__return_storage_ptr__,(kratos *)top_00,(Generator *)&stack0xffffffffffffff88,
               options_00);
    SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions
              ((SystemVerilogCodeGenOptions *)&stack0xffffffffffffff88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> generate_verilog(Generator* top,
                                                    SystemVerilogCodeGenOptions options) {
    if (options.package_name.empty()) {
        return generate_verilog_no_pkg(top, options);
    } else {
        generate_verilog_pkg(top, options);
        return {};
    }
}